

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRegistry.cpp
# Opt level: O3

void __thiscall TestRegistry::listTestGroupAndCaseNames(TestRegistry *this,TestResult *result)

{
  UtestShell *this_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar3;
  SimpleString groupAndNameList;
  SimpleString groupAndName;
  SimpleString SStack_48;
  SimpleString local_40 [2];
  UtestShell *this_01;
  
  SimpleString::SimpleString(&SStack_48,"");
  this_00 = (UtestShell *)(local_40 + 1);
  this_01 = this->tests_;
  while (this_01 != (UtestShell *)0x0) {
    bVar1 = UtestShell::shouldRun(this_01,this->groupFilters_,this->nameFilters_);
    if (bVar1) {
      SimpleString::SimpleString(local_40,"");
      SimpleString::operator+=(local_40,"#");
      UtestShell::getGroup(this_00);
      SimpleString::operator+=(local_40,(SimpleString *)this_00);
      SimpleString::~SimpleString((SimpleString *)this_00);
      SimpleString::operator+=(local_40,".");
      UtestShell::getName(this_00);
      SimpleString::operator+=(local_40,(SimpleString *)this_00);
      SimpleString::~SimpleString((SimpleString *)this_00);
      SimpleString::operator+=(local_40,"#");
      bVar1 = SimpleString::contains(&SStack_48,local_40);
      if (!bVar1) {
        SimpleString::operator+=(&SStack_48,local_40);
        SimpleString::operator+=(&SStack_48," ");
      }
      SimpleString::~SimpleString(local_40);
    }
    else {
      (*result->_vptr_TestResult[0xb])(result);
    }
    iVar2 = (*this_01->_vptr_UtestShell[3])(this_01);
    this_01 = (UtestShell *)CONCAT44(extraout_var,iVar2);
  }
  SimpleString::replace(&SStack_48,"#","");
  SimpleString::SimpleString(local_40," ");
  bVar1 = SimpleString::endsWith(&SStack_48,local_40);
  SimpleString::~SimpleString(local_40);
  if (bVar1) {
    SimpleString::size(&SStack_48);
    SimpleString::subString(local_40,(size_t)&SStack_48,0);
    SimpleString::operator=(&SStack_48,local_40);
    SimpleString::~SimpleString(local_40);
  }
  pcVar3 = SimpleString::asCharString(&SStack_48);
  (*result->_vptr_TestResult[0xe])(result,pcVar3);
  SimpleString::~SimpleString(&SStack_48);
  return;
}

Assistant:

void TestRegistry::listTestGroupAndCaseNames(TestResult& result)
{
    SimpleString groupAndNameList;

    for (UtestShell *test = tests_; test != NULL; test = test->getNext()) {
        if (testShouldRun(test, result)) {
            SimpleString groupAndName;
            groupAndName += "#";
            groupAndName += test->getGroup();
            groupAndName += ".";
            groupAndName += test->getName();
            groupAndName += "#";

            if (!groupAndNameList.contains(groupAndName)) {
                groupAndNameList += groupAndName;
                groupAndNameList += " ";
            }
        }
    }

    groupAndNameList.replace("#", "");

    if (groupAndNameList.endsWith(" "))
        groupAndNameList = groupAndNameList.subString(0, groupAndNameList.size() - 1);
    result.print(groupAndNameList.asCharString());
}